

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsImport.cpp
# Opt level: O3

int __thiscall gdscpp::calculate_STR_bounding_box(gdscpp *this,int structure_index,int *destination)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer pcVar4;
  pointer pgVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  uint uVar10;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result;
  int *piVar11;
  mapped_type *pmVar12;
  pointer pgVar13;
  long lVar14;
  uint uVar15;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __result_1;
  pointer pgVar16;
  pointer pgVar17;
  int *piVar18;
  int *piVar19;
  int iVar20;
  int *piVar21;
  int unaff_EBX;
  pointer pgVar22;
  int *piVar23;
  int *piVar24;
  int iVar25;
  int iVar26;
  int *piVar27;
  int unaff_R12D;
  pointer pgVar28;
  pointer pgVar29;
  int iVar30;
  int *piVar31;
  int unaff_R15D;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int local_2f8;
  int local_2e8;
  undefined1 local_2d8 [16];
  double local_2c8;
  double dStack_2c0;
  int local_2a8;
  double local_1f8;
  undefined1 local_1d0 [72];
  _Alloc_hider local_188;
  char local_178 [16];
  undefined1 local_168 [72];
  _Alloc_hider local_120;
  char local_110 [16];
  undefined1 local_100 [72];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [72];
  _Alloc_hider local_50;
  char local_40 [16];
  
  pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
            super__Vector_impl_data._M_start;
  pgVar16 = *(pointer *)
             &pgVar13[structure_index].BOUNDARY.
              super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl;
  if (pgVar16 ==
      *(pointer *)
       ((long)&pgVar13[structure_index].BOUNDARY.
               super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl + 8)) {
    bVar8 = false;
  }
  else {
    bVar8 = false;
    do {
      if (bVar8) {
        local_100._8_4_ = pgVar16->dataType;
        local_100._0_4_ = pgVar16->plex;
        local_100._4_4_ = pgVar16->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_100 + 0x10),&pgVar16->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_100 + 0x28),&pgVar16->yCor);
        local_100._64_4_ = pgVar16->propattr;
        local_b8._M_p = local_a8;
        pcVar4 = (pgVar16->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b8,pcVar4,pcVar4 + (pgVar16->propvalue)._M_string_length);
        iVar25 = *(int *)local_100._16_8_;
        iVar26 = *(int *)local_100._40_8_;
        iVar20 = iVar25;
        iVar30 = iVar26;
        piVar21 = (int *)local_100._40_8_;
        for (piVar11 = (int *)local_100._16_8_; piVar11 != (int *)local_100._24_8_;
            piVar11 = piVar11 + 1) {
          iVar9 = *piVar11;
          if (iVar9 < iVar20) {
            iVar20 = iVar9;
          }
          if (iVar25 < iVar9) {
            iVar25 = iVar9;
          }
          iVar9 = *piVar21;
          if (iVar9 < iVar30) {
            iVar30 = iVar9;
          }
          if (iVar26 < iVar9) {
            iVar26 = iVar9;
          }
          piVar21 = piVar21 + 1;
        }
        gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_100);
        if (iVar20 < unaff_EBX) {
          unaff_EBX = iVar20;
        }
        if (iVar30 < unaff_R15D) {
          unaff_R15D = iVar30;
        }
        if (local_2e8 < iVar25) {
          local_2e8 = iVar25;
        }
        if (unaff_R12D < iVar26) {
          unaff_R12D = iVar26;
        }
      }
      else {
        local_98._8_4_ = pgVar16->dataType;
        local_98._0_4_ = pgVar16->plex;
        local_98._4_4_ = pgVar16->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_98 + 0x10),&pgVar16->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_98 + 0x28),&pgVar16->yCor);
        local_98._64_4_ = pgVar16->propattr;
        local_50._M_p = local_40;
        pcVar4 = (pgVar16->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,pcVar4,pcVar4 + (pgVar16->propvalue)._M_string_length);
        local_2e8 = *(int *)local_98._16_8_;
        unaff_R15D = *(int *)local_98._40_8_;
        unaff_EBX = local_2e8;
        unaff_R12D = unaff_R15D;
        piVar21 = (int *)local_98._40_8_;
        for (piVar11 = (int *)local_98._16_8_; piVar11 != (int *)local_98._24_8_;
            piVar11 = piVar11 + 1) {
          iVar25 = *piVar11;
          if (iVar25 < unaff_EBX) {
            unaff_EBX = iVar25;
          }
          if (local_2e8 < iVar25) {
            local_2e8 = iVar25;
          }
          iVar25 = *piVar21;
          if (iVar25 < unaff_R15D) {
            unaff_R15D = iVar25;
          }
          if (unaff_R12D < iVar25) {
            unaff_R12D = iVar25;
          }
          piVar21 = piVar21 + 1;
        }
        gdsBOUNDARY::~gdsBOUNDARY((gdsBOUNDARY *)local_98);
        bVar8 = true;
      }
      pgVar16 = pgVar16 + 1;
      pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pgVar16 !=
             *(pointer *)
              ((long)&pgVar13[structure_index].BOUNDARY.
                      super__Vector_base<gdsBOUNDARY,_std::allocator<gdsBOUNDARY>_>._M_impl + 8));
  }
  pgVar17 = *(pointer *)
             &pgVar13[structure_index].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>.
              _M_impl;
  if (pgVar17 !=
      *(pointer *)
       ((long)&pgVar13[structure_index].BOX.super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>.
               _M_impl + 8)) {
    do {
      if (bVar8) {
        local_1d0._8_4_ = pgVar17->boxtype;
        local_1d0._0_4_ = pgVar17->plex;
        local_1d0._4_4_ = pgVar17->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_1d0 + 0x10),&pgVar17->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_1d0 + 0x28),&pgVar17->yCor);
        local_1d0._64_4_ = pgVar17->propattr;
        local_188._M_p = local_178;
        pcVar4 = (pgVar17->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,pcVar4,pcVar4 + (pgVar17->propvalue)._M_string_length);
        iVar25 = *(int *)local_1d0._16_8_;
        iVar26 = *(int *)local_1d0._40_8_;
        iVar20 = iVar25;
        iVar30 = iVar26;
        piVar21 = (int *)local_1d0._40_8_;
        for (piVar11 = (int *)local_1d0._16_8_; piVar11 != (int *)local_1d0._24_8_;
            piVar11 = piVar11 + 1) {
          iVar9 = *piVar11;
          if (iVar9 < iVar20) {
            iVar20 = iVar9;
          }
          if (iVar25 < iVar9) {
            iVar25 = iVar9;
          }
          iVar9 = *piVar21;
          if (iVar9 < iVar30) {
            iVar30 = iVar9;
          }
          if (iVar26 < iVar9) {
            iVar26 = iVar9;
          }
          piVar21 = piVar21 + 1;
        }
        gdsBOX::~gdsBOX((gdsBOX *)local_1d0);
        if (iVar20 < unaff_EBX) {
          unaff_EBX = iVar20;
        }
        if (iVar30 < unaff_R15D) {
          unaff_R15D = iVar30;
        }
        if (local_2e8 < iVar25) {
          local_2e8 = iVar25;
        }
        if (unaff_R12D < iVar26) {
          unaff_R12D = iVar26;
        }
      }
      else {
        local_168._8_4_ = pgVar17->boxtype;
        local_168._0_4_ = pgVar17->plex;
        local_168._4_4_ = pgVar17->layer;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_168 + 0x10),&pgVar17->xCor);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)(local_168 + 0x28),&pgVar17->yCor);
        local_168._64_4_ = pgVar17->propattr;
        local_120._M_p = local_110;
        pcVar4 = (pgVar17->propvalue)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_120,pcVar4,pcVar4 + (pgVar17->propvalue)._M_string_length);
        local_2e8 = *(int *)local_168._16_8_;
        unaff_R12D = *(int *)local_168._40_8_;
        unaff_EBX = local_2e8;
        unaff_R15D = unaff_R12D;
        piVar21 = (int *)local_168._40_8_;
        for (piVar11 = (int *)local_168._16_8_; piVar11 != (int *)local_168._24_8_;
            piVar11 = piVar11 + 1) {
          iVar25 = *piVar11;
          if (iVar25 < unaff_EBX) {
            unaff_EBX = iVar25;
          }
          if (local_2e8 < iVar25) {
            local_2e8 = iVar25;
          }
          iVar25 = *piVar21;
          if (iVar25 < unaff_R15D) {
            unaff_R15D = iVar25;
          }
          if (unaff_R12D < iVar25) {
            unaff_R12D = iVar25;
          }
          piVar21 = piVar21 + 1;
        }
        gdsBOX::~gdsBOX((gdsBOX *)local_168);
        bVar8 = true;
      }
      pgVar17 = pgVar17 + 1;
      pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pgVar17 !=
             *(pointer *)
              ((long)&pgVar13[structure_index].BOX.
                      super__Vector_base<gdsBOX,_std::allocator<gdsBOX>_>._M_impl + 8));
  }
  pgVar5 = *(pointer *)
            ((long)&pgVar13[structure_index].PATH.
                    super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>._M_impl + 8);
  local_2f8 = unaff_R15D;
  local_2a8 = local_2e8;
  for (pgVar28 = pgVar13[structure_index].PATH.super__Vector_base<gdsPATH,_std::allocator<gdsPATH>_>
                 ._M_impl.super__Vector_impl_data._M_start; pgVar28 != pgVar5; pgVar28 = pgVar28 + 1
      ) {
    dVar32 = round((double)pgVar28->width * 0.5);
    piVar11 = (pgVar28->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar21 = *(pointer *)
               ((long)&(pgVar28->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    piVar23 = piVar11 + 1;
    piVar18 = piVar11;
    if (piVar23 != piVar21 && piVar11 != piVar21) {
      iVar25 = *piVar11;
      piVar19 = piVar23;
      do {
        if (*piVar19 < iVar25) {
          piVar18 = piVar19;
          iVar25 = *piVar19;
        }
        piVar19 = piVar19 + 1;
      } while (piVar19 != piVar21);
    }
    piVar19 = (pgVar28->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = *(pointer *)
              ((long)&(pgVar28->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
    piVar24 = piVar19 + 1;
    piVar27 = piVar19;
    if (piVar24 != piVar6 && piVar19 != piVar6) {
      iVar25 = *piVar19;
      piVar31 = piVar24;
      do {
        if (*piVar31 < iVar25) {
          piVar27 = piVar31;
          iVar25 = *piVar31;
        }
        piVar31 = piVar31 + 1;
      } while (piVar31 != piVar6);
    }
    if (piVar23 != piVar21 && piVar11 != piVar21) {
      iVar25 = *piVar11;
      do {
        iVar26 = *piVar23;
        iVar20 = iVar25;
        if (iVar25 <= iVar26) {
          iVar20 = iVar26;
        }
        if (iVar25 < iVar26) {
          piVar11 = piVar23;
        }
        piVar23 = piVar23 + 1;
        iVar25 = iVar20;
      } while (piVar23 != piVar21);
    }
    iVar26 = (int)dVar32;
    iVar25 = *piVar11 + iVar26;
    if (piVar24 != piVar6 && piVar19 != piVar6) {
      iVar20 = *piVar19;
      do {
        iVar30 = *piVar24;
        iVar9 = iVar20;
        if (iVar20 <= iVar30) {
          iVar9 = iVar30;
        }
        if (iVar20 < iVar30) {
          piVar19 = piVar24;
        }
        piVar24 = piVar24 + 1;
        iVar20 = iVar9;
      } while (piVar24 != piVar6);
    }
    iVar20 = *piVar18 - iVar26;
    iVar30 = *piVar27 - iVar26;
    iVar26 = iVar26 + *piVar19;
    if (bVar8) {
      if (unaff_EBX <= iVar20) {
        iVar20 = unaff_EBX;
      }
      if (iVar25 <= local_2a8) {
        iVar25 = local_2a8;
      }
      if (local_2f8 <= iVar30) {
        iVar30 = local_2f8;
      }
      if (iVar26 <= unaff_R12D) {
        iVar26 = unaff_R12D;
      }
    }
    else {
      bVar8 = true;
    }
    unaff_R12D = iVar26;
    local_2f8 = iVar30;
    unaff_EBX = iVar20;
    local_2a8 = iVar25;
  }
  pgVar22 = pgVar13[structure_index].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (pgVar22 !=
      *(pointer *)
       ((long)&pgVar13[structure_index].SREF.super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>.
               _M_impl + 8)) {
    do {
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->STR_Lookup,&pgVar22->name);
      iVar25 = *pmVar12;
      if ((long)iVar25 == 1000000000) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: reference to structure with no name.",0x2b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Terminating SREF bounding box check.",0x24);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                  super__Vector_impl_data._M_start;
        break;
      }
      piVar11 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start[iVar25].bounding_box;
      iVar26 = *piVar11;
      iVar20 = piVar11[1];
      iVar30 = piVar11[2];
      iVar9 = piVar11[3];
      auVar41._0_4_ = -(uint)(iVar26 == 0);
      auVar41._4_4_ = -(uint)(iVar20 == 0);
      auVar41._8_4_ = -(uint)(iVar30 == 0);
      auVar41._12_4_ = -(uint)(iVar9 == 0);
      iVar25 = movmskps(iVar25 * 0xf8,auVar41);
      if (iVar25 == 0xf) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Warning: Inaccuracy due to structures not being initialized.",0x3c);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      iVar25 = -iVar20;
      iVar1 = -iVar9;
      if (pgVar22->reflection == false) {
        iVar25 = iVar9;
        iVar1 = iVar20;
      }
      dVar42 = (double)iVar26;
      dVar32 = pgVar22->scale;
      auVar47._0_8_ = dVar32 * (double)iVar1;
      auVar47._8_8_ = dVar32 * dVar42;
      if ((dVar32 == 1.0) && (!NAN(dVar32))) {
        auVar47._8_8_ = dVar42;
        auVar47._0_8_ = (double)iVar1;
      }
      dVar43 = (double)iVar30;
      dVar42 = dVar32 * (double)iVar25;
      dVar33 = dVar32 * dVar43;
      if ((dVar32 == 1.0) && (!NAN(dVar32))) {
        dVar42 = (double)iVar25;
        dVar33 = dVar43;
      }
      uVar10 = (uint)pgVar22->angle;
      local_2d8._8_4_ = SUB84(dVar33,0);
      local_2d8._0_8_ = dVar42;
      local_2d8._12_4_ = (int)((ulong)dVar33 >> 0x20);
      if (0 < (int)uVar10) {
        uVar15 = 0x167;
        if (0x167 < uVar10) {
          uVar15 = uVar10;
        }
        dVar32 = ((double)(int)((uVar15 / 0x168) * -0x168 + uVar10) * 3.141592653589) / 180.0;
        dVar33 = cos(dVar32);
        dVar43 = sin(dVar32);
        local_1f8 = -auVar47._0_8_;
        dVar34 = sin(dVar32);
        dVar35 = cos(dVar32);
        dVar36 = cos(dVar32);
        dVar37 = sin(dVar32);
        dVar38 = sin(dVar32);
        dVar32 = cos(dVar32);
        dStack_2c0 = auVar47._8_8_;
        auVar48._8_8_ = dVar33 * dStack_2c0 + local_1f8 * dVar43;
        auVar48._0_8_ = dVar34 * dStack_2c0 + dVar35 * auVar47._0_8_;
        dVar32 = dVar38 * (double)local_2d8._8_8_ + dVar32 * dVar42;
        dVar42 = dVar36 * (double)local_2d8._8_8_ + -dVar42 * dVar37;
        auVar46._8_8_ = dVar42;
        auVar46._0_8_ = dVar32;
        auVar47 = minpd(auVar46,auVar48);
        auVar7._8_4_ = SUB84(dVar42,0);
        auVar7._0_8_ = dVar32;
        auVar7._12_4_ = (int)((ulong)dVar42 >> 0x20);
        local_2d8 = maxpd(auVar48,auVar7);
      }
      dVar32 = round(auVar47._8_8_);
      iVar25 = pgVar22->xCor;
      iVar26 = pgVar22->yCor;
      iVar30 = (int)dVar32 + iVar25;
      local_2c8 = auVar47._0_8_;
      dVar32 = round(local_2c8);
      iVar20 = (int)dVar32 + iVar26;
      dVar32 = round((double)local_2d8._8_8_);
      iVar25 = (int)dVar32 + iVar25;
      dVar32 = round((double)local_2d8._0_8_);
      iVar26 = (int)dVar32 + iVar26;
      if (bVar8) {
        if (unaff_EBX <= iVar30) {
          iVar30 = unaff_EBX;
        }
        unaff_EBX = iVar30;
        if (iVar25 <= local_2a8) {
          iVar25 = local_2a8;
        }
        local_2a8 = iVar25;
        if (local_2f8 <= iVar20) {
          iVar20 = local_2f8;
        }
        local_2f8 = iVar20;
        if (iVar26 <= unaff_R12D) {
          iVar26 = unaff_R12D;
        }
      }
      else {
        bVar8 = true;
        local_2f8 = iVar20;
        unaff_EBX = iVar30;
        local_2a8 = iVar25;
      }
      unaff_R12D = iVar26;
      pgVar22 = pgVar22 + 1;
      pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (pgVar22 !=
             *(pointer *)
              ((long)&pgVar13[structure_index].SREF.
                      super__Vector_base<gdsSREF,_std::allocator<gdsSREF>_>._M_impl + 8));
  }
  pgVar29 = *(pointer *)
             &pgVar13[structure_index].AREF.super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>.
              _M_impl;
  if (pgVar29 !=
      *(pointer *)
       ((long)&pgVar13[structure_index].AREF.super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>.
               _M_impl + 8)) {
    do {
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&this->STR_Lookup,&pgVar29->name);
      lVar14 = (long)*pmVar12;
      if (lVar14 == 1000000000) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Error: reference to structure with no name.",0x2b);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Terminating AREF bounding box check.",0x24);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        break;
      }
      pgVar13 = (this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar25 = pgVar13[lVar14].bounding_box[0];
      iVar26 = pgVar13[lVar14].bounding_box[1];
      iVar20 = pgVar13[lVar14].bounding_box[2];
      iVar30 = pgVar13[lVar14].bounding_box[3];
      if (((iVar25 == 0 && iVar26 == 0) && iVar20 == 0) && iVar30 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Warning: Structure being referenced for AREF does not have an initialized",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "bounding box. Therefore, bounding boxes of references will be inaccurate.",0x49)
        ;
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "Calculate bounding boxes from the lowest level (unreferenced) upwards.",0x46);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
        std::ostream::put(-0x70);
        std::ostream::flush();
      }
      dVar32 = pgVar29->angle;
      dVar33 = (double)pgVar29->xCor;
      dVar43 = (double)pgVar29->yCor;
      iVar9 = pgVar29->xCorRow;
      iVar1 = pgVar29->yCorRow;
      iVar2 = pgVar29->xCorCol;
      iVar3 = pgVar29->yCorCol;
      dVar42 = ((double)-(int)dVar32 * 3.141592653589) / 180.0;
      dVar34 = sin(dVar42);
      dVar35 = cos(dVar42);
      dVar34 = round((dVar35 * ((double)iVar9 - dVar33) - ((double)iVar1 - dVar43) * dVar34) +
                     dVar33);
      dVar35 = sin(dVar42);
      dVar42 = cos(dVar42);
      dVar42 = round(dVar42 * ((double)iVar3 - dVar43) + ((double)iVar2 - dVar33) * dVar35 + dVar43)
      ;
      iVar9 = pgVar29->colCnt;
      iVar1 = pgVar29->rowCnt;
      dVar32 = ((double)(int)dVar32 * 3.141592653589) / 180.0;
      dVar35 = sin(dVar32);
      dVar36 = cos(dVar32);
      dVar37 = dVar33 - dVar33;
      dVar44 = dVar43 - dVar43;
      dVar38 = round((dVar37 * dVar36 - dVar35 * dVar44) + dVar33);
      dVar35 = round(dVar36 * dVar44 + dVar37 * dVar35 + dVar43);
      dVar36 = sin(dVar32);
      dVar39 = cos(dVar32);
      dVar34 = ((double)(iVar20 - iVar25) + (dVar34 - (dVar34 - dVar33) / (double)iVar9)) - dVar33;
      dVar40 = round((dVar34 * dVar39 - dVar36 * dVar44) + dVar33);
      dVar36 = round(dVar39 * dVar44 + dVar34 * dVar36 + dVar43);
      dVar39 = sin(dVar32);
      dVar44 = cos(dVar32);
      dVar45 = ((dVar42 - (dVar42 - dVar43) / (double)iVar1) + (double)(iVar30 - iVar26)) - dVar43;
      dVar42 = round((dVar34 * dVar44 - dVar39 * dVar45) + dVar33);
      dVar34 = round(dVar44 * dVar45 + dVar34 * dVar39 + dVar43);
      dVar39 = sin(dVar32);
      dVar32 = cos(dVar32);
      dVar33 = round((dVar37 * dVar32 - dVar39 * dVar45) + dVar33);
      dVar32 = round(dVar32 * dVar45 + dVar37 * dVar39 + dVar43);
      iVar25 = (int)dVar38;
      if (dVar40 < (double)(int)dVar38) {
        iVar25 = (int)dVar40;
      }
      if (dVar42 < (double)iVar25) {
        iVar25 = (int)dVar42;
      }
      iVar26 = (int)dVar38;
      if ((double)(int)dVar38 < dVar40) {
        iVar26 = (int)dVar40;
      }
      if ((double)iVar26 < dVar42) {
        iVar26 = (int)dVar42;
      }
      iVar20 = (int)dVar33;
      if ((double)iVar25 <= dVar33 && dVar33 <= (double)iVar26) {
        iVar20 = iVar25;
      }
      iVar25 = (int)dVar35;
      if (dVar36 < (double)(int)dVar35) {
        iVar25 = (int)dVar36;
      }
      if (dVar34 < (double)iVar25) {
        iVar25 = (int)dVar34;
      }
      if (dVar32 < (double)iVar25) {
        iVar25 = (int)dVar32;
      }
      iVar30 = (int)dVar35;
      if ((double)(int)dVar35 < dVar36) {
        iVar30 = (int)dVar36;
      }
      if ((double)iVar30 < dVar34) {
        iVar30 = (int)dVar34;
      }
      if ((double)iVar30 < dVar32) {
        iVar30 = (int)dVar32;
      }
      if (bVar8) {
        if (unaff_EBX <= iVar20) {
          iVar20 = unaff_EBX;
        }
        if (iVar26 <= local_2a8) {
          iVar26 = local_2a8;
        }
        local_2a8 = iVar26;
        if (local_2f8 <= iVar25) {
          iVar25 = local_2f8;
        }
        local_2f8 = iVar25;
        unaff_EBX = iVar20;
        if (iVar30 <= unaff_R12D) {
          iVar30 = unaff_R12D;
        }
      }
      else {
        bVar8 = true;
        local_2a8 = iVar26;
        local_2f8 = iVar25;
        unaff_EBX = iVar20;
      }
      unaff_R12D = iVar30;
      pgVar29 = pgVar29 + 1;
    } while (pgVar29 !=
             *(pointer *)
              ((long)&(this->STR).super__Vector_base<gdsSTR,_std::allocator<gdsSTR>_>._M_impl.
                      super__Vector_impl_data._M_start[structure_index].AREF.
                      super__Vector_base<gdsAREF,_std::allocator<gdsAREF>_>._M_impl + 8));
  }
  *destination = unaff_EBX;
  destination[1] = local_2f8;
  destination[2] = local_2a8;
  destination[3] = unaff_R12D;
  return 0;
}

Assistant:

int gdscpp::calculate_STR_bounding_box(int structure_index, int *destination)
{
  int bound_box[4]; // xmin, ymin, xmax, ymax of structure
  bool box_initialized = false;
  // ======================= Look through boundaries =======================
  auto boundary_iterator = STR[structure_index].BOUNDARY.begin();
  while (boundary_iterator != STR[structure_index].BOUNDARY.end()) {
    int STR_bound_box[4];
    if (box_initialized == false) {
      // Initialize bounding box
      fetch_boundary_bounding_box(*boundary_iterator, bound_box);
      box_initialized = true;
    } else {
      // Compare for minimum/maximums
      fetch_boundary_bounding_box(*boundary_iterator, STR_bound_box);
      if (STR_bound_box[0] < bound_box[0])
        bound_box[0] = STR_bound_box[0];
      if (STR_bound_box[1] < bound_box[1])
        bound_box[1] = STR_bound_box[1];
      if (STR_bound_box[2] > bound_box[2])
        bound_box[2] = STR_bound_box[2];
      if (STR_bound_box[3] > bound_box[3])
        bound_box[3] = STR_bound_box[3];
    }
    boundary_iterator++;
  }
  // ========================= Look through boxes ==========================
  auto box_iter = STR[structure_index].BOX.begin();
  while (box_iter != STR[structure_index].BOX.end()) {
    int BOX_bound_box[4];
    if (box_initialized == false) {
      fetch_box_bounding_box(*box_iter, bound_box);
      box_initialized = true;
    } else {
      fetch_box_bounding_box(*box_iter, BOX_bound_box);
      if (BOX_bound_box[0] < bound_box[0])
        bound_box[0] = BOX_bound_box[0];
      if (BOX_bound_box[1] < bound_box[1])
        bound_box[1] = BOX_bound_box[1];
      if (BOX_bound_box[2] > bound_box[2])
        bound_box[2] = BOX_bound_box[2];
      if (BOX_bound_box[3] > bound_box[3])
        bound_box[3] = BOX_bound_box[3];
    }
    box_iter++;
  }
  // ========================= Look through paths ==========================
  auto path_iter = STR[structure_index].PATH.begin();
  while (path_iter != STR[structure_index].PATH.end()) {
    // Neglect path type. Simplify work by assuming max half-width protrusion.
    // Worst case scenario is that the bounding box is ever so slightly
    // bigger than actually needed for a flat-cap situation.
    int offset = (int)(round(((double)path_iter->width * 0.5)));
    int local_bbox[4] = {
        (*min_element(path_iter->xCor.begin(), path_iter->xCor.end()) - offset),
        (*min_element(path_iter->yCor.begin(), path_iter->yCor.end()) - offset),
        (*max_element(path_iter->xCor.begin(), path_iter->xCor.end()) + offset),
        (*max_element(path_iter->yCor.begin(), path_iter->yCor.end()) +
         offset)};
    if (box_initialized == false) {
      bound_box[0] = local_bbox[0];
      bound_box[1] = local_bbox[1];
      bound_box[2] = local_bbox[2];
      bound_box[3] = local_bbox[3];
      box_initialized = true;
    }
    if (local_bbox[0] < bound_box[0])
      bound_box[0] = local_bbox[0]; // new minimum
    if (local_bbox[2] > bound_box[2])
      bound_box[2] = local_bbox[2]; // new maximum
    if (local_bbox[1] < bound_box[1])
      bound_box[1] = local_bbox[1];
    if (local_bbox[3] > bound_box[3])
      bound_box[3] = local_bbox[3];
    path_iter++;
  }
  // ================== Look through structure references ==================
  auto SREF_iter = STR[structure_index].SREF.begin();
  while (SREF_iter != STR[structure_index].SREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[SREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating SREF bounding box check." << endl;
      break;
    }
    int referred_bound_box[4];
    referred_bound_box[0] = STR[target_structure_index].bounding_box[0];
    referred_bound_box[1] = STR[target_structure_index].bounding_box[1];
    referred_bound_box[2] = STR[target_structure_index].bounding_box[2];
    referred_bound_box[3] = STR[target_structure_index].bounding_box[3];

    if ((referred_bound_box[0] == 0) && (referred_bound_box[1] == 0) &&
        (referred_bound_box[2] == 0) && (referred_bound_box[3] == 0)) {
      // cout << "Warning: Structure being referenced does not have an
      // initialized"
      //      << endl;
      // cout << "bounding box. Therefore, bounding boxes of references will be
      // "
      //         "inaccurate."
      //      << endl;
      // cout << "Calculate bounding boxes from the lowest level (unreferenced)
      // "
      //         "upwards."
      //      << endl;
      cout << "Warning: Inaccuracy due to structures not being initialized."
           << endl;
    }
    if (SREF_iter->reflection == true) // Reflect about x-axis
    {
      // Reflect the box about x-axis and swap because max becomes min
      int placeholder = referred_bound_box[1];
      referred_bound_box[1] = -1 * referred_bound_box[3];
      referred_bound_box[3] = -1 * placeholder;
    }
    double x_1 = referred_bound_box[0];
    double y_1 = referred_bound_box[1];
    double x_2 = referred_bound_box[2];
    double y_2 = referred_bound_box[3];
    if (SREF_iter->scale != 1) // Multiply by scale factor
    {
      x_1 = x_1 * SREF_iter->scale;
      x_2 = x_2 * SREF_iter->scale;
      y_1 = y_1 * SREF_iter->scale;
      y_2 = y_2 * SREF_iter->scale;
    }
    // Rotate
    int angle = SREF_iter->angle;
    if (angle > 0) {
      while (angle >= 360) {
        angle = angle - 360;
      }
      double x_1_new = x_1 * cos(angle * 3.141592653589 / 180) -
                       y_1 * sin(angle * 3.141592653589 / 180);
      double y_1_new = x_1 * sin(angle * 3.141592653589 / 180) +
                       y_1 * cos(angle * 3.141592653589 / 180);
      double x_2_new = x_2 * cos(angle * 3.141592653589 / 180) -
                       y_2 * sin(angle * 3.141592653589 / 180);
      double y_2_new = x_2 * sin(angle * 3.141592653589 / 180) +
                       y_2 * cos(angle * 3.141592653589 / 180);
      x_1 = x_1_new;
      y_1 = y_1_new;
      x_2 = x_2_new;
      y_2 = y_2_new;
      // convert back to vertical box by getting the new minimum and maximum
      if (x_1 > x_2) {
        double temp_holder = x_2;
        x_2 = x_1;
        x_1 = temp_holder;
      }
      if (y_1 > y_2) {
        double temp_holder2 = y_2;
        y_2 = y_1;
        y_1 = temp_holder2;
      }
    }
    // Offset shape according to translation
    referred_bound_box[0] = (int)(round(x_1)) + SREF_iter->xCor;
    referred_bound_box[1] = (int)(round(y_1)) + SREF_iter->yCor;
    referred_bound_box[2] = (int)(round(x_2)) + SREF_iter->xCor;
    referred_bound_box[3] = (int)(round(y_2)) + SREF_iter->yCor;

    if (box_initialized == false) {
      bound_box[0] = referred_bound_box[0];
      bound_box[1] = referred_bound_box[1];
      bound_box[2] = referred_bound_box[2];
      bound_box[3] = referred_bound_box[3];
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (referred_bound_box[0] < bound_box[0])
      bound_box[0] = referred_bound_box[0]; // new minimum
    if (referred_bound_box[2] > bound_box[2])
      bound_box[2] = referred_bound_box[2]; // new maximum
    if (referred_bound_box[1] < bound_box[1])
      bound_box[1] = referred_bound_box[1];
    if (referred_bound_box[3] > bound_box[3])
      bound_box[3] = referred_bound_box[3];

    SREF_iter++;
  }
  // ==================== Look through array references ====================
  auto AREF_iter = STR[structure_index].AREF.begin();
  while (AREF_iter != STR[structure_index].AREF.end()) {
    // Warn user if specified structure's bounding box is not yet initialized
    int target_structure_index = STR_Lookup[AREF_iter->name];
    if (target_structure_index == 1000000000) {
      cout << "Error: reference to structure with no name." << endl;
      cout << "Terminating AREF bounding box check." << endl;
      break;
    }
    // fetch bounding box of the array reference structure
    int a_referred_bound_box[4] = {STR[target_structure_index].bounding_box[0],
                                   STR[target_structure_index].bounding_box[1],
                                   STR[target_structure_index].bounding_box[2],
                                   STR[target_structure_index].bounding_box[3]};
    if ((a_referred_bound_box[0] == 0) && (a_referred_bound_box[1] == 0) &&
        (a_referred_bound_box[2] == 0) && (a_referred_bound_box[3] == 0)) {
      cout << "Warning: Structure being referenced for AREF does not have an "
              "initialized"
           << endl;
      cout << "bounding box. Therefore, bounding boxes of references will be "
              "inaccurate."
           << endl;
      cout << "Calculate bounding boxes from the lowest level (unreferenced) "
              "upwards."
           << endl;
    }
    // Rotate array reference back to original dimensions
    POINT cor, corRow, corCol, true_max;
    POINT enclosed_array[4];
    int aref_angle = AREF_iter->angle;
    cor.x = (double)AREF_iter->xCor;
    cor.y = (double)AREF_iter->yCor;
    corRow.x = (double)AREF_iter->xCorRow;
    corRow.y = (double)AREF_iter->yCorRow;
    corCol.x = (double)AREF_iter->xCorCol;
    corCol.y = (double)AREF_iter->yCorCol;
    rotate_point(cor.x, cor.y, (-aref_angle), corRow);
    rotate_point(cor.x, cor.y, (-aref_angle), corCol);
    // Determine the true endpoints (without blank space at end)
    int referred_structure_width =
        a_referred_bound_box[2] - a_referred_bound_box[0];
    int referred_structure_height =
        a_referred_bound_box[3] - a_referred_bound_box[1];
    double column_spacing = (corRow.x - cor.x) / AREF_iter->colCnt;
    double row_spacing = (corCol.y - cor.y) / AREF_iter->rowCnt;
    true_max.x = corRow.x - column_spacing + referred_structure_width;
    true_max.y = corCol.y - row_spacing + referred_structure_height;
    enclosed_array[0].x = cor.x;
    enclosed_array[0].y = cor.y;
    enclosed_array[1].x = true_max.x;
    enclosed_array[1].y = cor.y;
    enclosed_array[2].x = true_max.x;
    enclosed_array[2].y = true_max.y;
    enclosed_array[3].x = cor.x;
    enclosed_array[3].y = true_max.y;
    // Rotate the 4 points of the box to their correct positions
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[0]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[1]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[2]);
    rotate_point(cor.x, cor.y, aref_angle, enclosed_array[3]);
    // Determine min/maxes for new box
    int x_min, y_min, x_max, y_max;
    x_min = (int)enclosed_array[0].x;
    if (enclosed_array[1].x < (double)x_min)
      x_min = (int)enclosed_array[1].x;
    if (enclosed_array[2].x < (double)x_min)
      x_min = (int)enclosed_array[2].x;
    if (enclosed_array[3].x < (double)x_min)
      x_min = (int)enclosed_array[3].x;

    x_max = (int)enclosed_array[0].x;
    if (enclosed_array[1].x > (double)x_max)
      x_max = (int)enclosed_array[1].x;
    if (enclosed_array[2].x > (double)x_max)
      x_max = (int)enclosed_array[2].x;
    if (enclosed_array[3].x > (double)x_max)
      x_min = (int)enclosed_array[3].x;

    y_min = (int)enclosed_array[0].y;
    if (enclosed_array[1].y < (double)y_min)
      y_min = (int)enclosed_array[1].y;
    if (enclosed_array[2].y < (double)y_min)
      y_min = (int)enclosed_array[2].y;
    if (enclosed_array[3].y < (double)y_min)
      y_min = (int)enclosed_array[3].y;

    y_max = (int)enclosed_array[0].y;
    if (enclosed_array[1].y > (double)y_max)
      y_max = (int)enclosed_array[1].y;
    if (enclosed_array[2].y > (double)y_max)
      y_max = (int)enclosed_array[2].y;
    if (enclosed_array[3].y > (double)y_max)
      y_max = (int)enclosed_array[3].y;

    // Do the comparison against the structure bounding box
    if (box_initialized == false) {
      bound_box[0] = x_min;
      bound_box[1] = y_min;
      bound_box[2] = x_max;
      bound_box[3] = y_max;
      box_initialized = true;
    }
    // See if min, max x,y becomes the structures min, max x,y
    if (x_min < bound_box[0])
      bound_box[0] = x_min; // new minimum
    if (x_max > bound_box[2])
      bound_box[2] = x_max; // new maximum
    if (y_min < bound_box[1])
      bound_box[1] = y_min;
    if (y_max > bound_box[3])
      bound_box[3] = y_max;
    AREF_iter++;
  }
  // =============== Send the bounding box to specified array ==============
  destination[0] = bound_box[0];
  destination[1] = bound_box[1];
  destination[2] = bound_box[2];
  destination[3] = bound_box[3];
  return EXIT_SUCCESS;
}